

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O3

void __thiscall avro::Validator::enumAdvance(Validator *this)

{
  pointer pCVar1;
  
  if (this->compoundStarted_ == true) {
    this->count_ = 0;
    this->nextType_ = AVRO_LONG;
    this->expectedTypesFlag_ = 0xc;
    this->compoundStarted_ = false;
    this->waitingForCount_ = true;
    return;
  }
  this->waitingForCount_ = false;
  pCVar1 = (this->compoundStack_).
           super__Vector_base<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->compoundStack_).
  super__Vector_base<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>.
  _M_impl.super__Vector_impl_data._M_finish = pCVar1 + -1;
  boost::detail::shared_count::~shared_count(&pCVar1[-1].node.pn);
  return;
}

Assistant:

void
Validator::enumAdvance()
{
    if(compoundStarted_) {
        setWaitingForCount();
        compoundStarted_ = false;
    }
    else {
        waitingForCount_ = false;
        compoundStack_.pop_back();
    }
}